

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O0

saint_t sufcheck64(sauchar_t *T,saidx64_t *SA,saidx64_t n,saint_t verbose)

{
  byte bVar1;
  long lVar2;
  long lVar3;
  int in_ECX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  saint_t c;
  saidx64_t t;
  saidx64_t q;
  saidx64_t p;
  saidx64_t i;
  saidx64_t C [256];
  undefined8 local_868;
  uint local_84c;
  long local_848;
  long local_838;
  long local_830;
  long alStack_828 [256];
  int local_24;
  long local_20;
  long local_18;
  long local_10;
  saint_t local_4;
  
  local_24 = in_ECX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  if (in_ECX != 0) {
    fprintf(_stderr,"sufcheck: ");
  }
  if (((local_10 == 0) || (local_18 == 0)) || (local_20 < 0)) {
    if (local_24 != 0) {
      fprintf(_stderr,"Invalid arguments.\n");
    }
    local_4 = -1;
  }
  else if (local_20 == 0) {
    if (local_24 != 0) {
      fprintf(_stderr,"Done.\n");
    }
    local_4 = 0;
  }
  else {
    for (local_830 = 0; local_830 < local_20; local_830 = local_830 + 1) {
      if ((*(long *)(local_18 + local_830 * 8) < 0) ||
         (local_20 <= *(long *)(local_18 + local_830 * 8))) {
        if (local_24 != 0) {
          fprintf(_stderr,"Out of the range [0,%ld].\n  SA[%ld]=%ld\n",local_20 + -1,local_830,
                  *(undefined8 *)(local_18 + local_830 * 8));
        }
        return -2;
      }
    }
    for (local_830 = 1; local_830 < local_20; local_830 = local_830 + 1) {
      if (*(byte *)(local_10 + *(long *)(local_18 + local_830 * 8)) <
          *(byte *)(local_10 + *(long *)(local_18 + (local_830 + -1) * 8))) {
        if (local_24 != 0) {
          fprintf(_stderr,"Suffixes in wrong order.\n  T[SA[%ld]=%ld]=%d > T[SA[%ld]=%ld]=%d\n",
                  local_830 + -1,*(undefined8 *)(local_18 + (local_830 + -1) * 8),
                  (ulong)*(byte *)(local_10 + *(long *)(local_18 + (local_830 + -1) * 8)),local_830,
                  *(undefined8 *)(local_18 + local_830 * 8),
                  (uint)*(byte *)(local_10 + *(long *)(local_18 + local_830 * 8)));
        }
        return -3;
      }
    }
    for (local_830 = 0; local_830 < 0x100; local_830 = local_830 + 1) {
      alStack_828[local_830] = 0;
    }
    for (local_830 = 0; local_830 < local_20; local_830 = local_830 + 1) {
      alStack_828[*(byte *)(local_10 + local_830)] =
           alStack_828[*(byte *)(local_10 + local_830)] + 1;
    }
    local_838 = 0;
    for (local_830 = 0; local_830 < 0x100; local_830 = local_830 + 1) {
      lVar2 = alStack_828[local_830];
      alStack_828[local_830] = local_838;
      local_838 = lVar2 + local_838;
    }
    lVar2 = alStack_828[*(byte *)(local_10 + local_20 + -1)];
    bVar1 = *(byte *)(local_10 + local_20 + -1);
    alStack_828[bVar1] = alStack_828[bVar1] + 1;
    for (local_830 = 0; local_830 < local_20; local_830 = local_830 + 1) {
      lVar3 = *(long *)(local_18 + local_830 * 8);
      if (lVar3 < 1) {
        local_838 = local_20 + -1;
        local_84c = (uint)*(byte *)(local_10 + local_838);
        local_848 = lVar2;
      }
      else {
        local_838 = lVar3 + -1;
        local_84c = (uint)*(byte *)(local_10 + -1 + lVar3);
        local_848 = alStack_828[(int)local_84c];
      }
      if ((local_848 < 0) || (local_838 != *(long *)(local_18 + local_848 * 8))) {
        if (local_24 != 0) {
          if (local_848 < 0) {
            local_868 = 0xffffffffffffffff;
          }
          else {
            local_868 = *(undefined8 *)(local_18 + local_848 * 8);
          }
          fprintf(_stderr,"Suffix in wrong position.\n  SA[%ld]=%ld or\n  SA[%ld]=%ld\n",local_848,
                  local_868,local_830,*(undefined8 *)(local_18 + local_830 * 8));
        }
        return -4;
      }
      if ((local_848 != lVar2) &&
         ((alStack_828[(int)local_84c] = alStack_828[(int)local_84c] + 1,
          local_20 <= alStack_828[(int)local_84c] ||
          (*(byte *)(local_10 + *(long *)(local_18 + alStack_828[(int)local_84c] * 8)) != local_84c)
          ))) {
        alStack_828[(int)local_84c] = -1;
      }
    }
    if (0 < local_24) {
      fprintf(_stderr,"Done.\n");
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

saint_t
sufcheck(const sauchar_t *T, const saidx_t *SA,
         saidx_t n, saint_t verbose) {
  saidx_t C[ALPHABET_SIZE];
  saidx_t i, p, q, t;
  saint_t c;

  if(verbose) { fprintf(stderr, "sufcheck: "); }

  /* Check arguments. */
  if((T == NULL) || (SA == NULL) || (n < 0)) {
    if(verbose) { fprintf(stderr, "Invalid arguments.\n"); }
    return -1;
  }
  if(n == 0) {
    if(verbose) { fprintf(stderr, "Done.\n"); }
    return 0;
  }

  /* check range: [0..n-1] */
  for(i = 0; i < n; ++i) {
    if((SA[i] < 0) || (n <= SA[i])) {
      if(verbose) {
        fprintf(stderr, "Out of the range [0,%" PRIdSAIDX_T "].\n"
                        "  SA[%" PRIdSAIDX_T "]=%" PRIdSAIDX_T "\n",
                        n - 1, i, SA[i]);
      }
      return -2;
    }
  }

  /* check first characters. */
  for(i = 1; i < n; ++i) {
    if(T[SA[i - 1]] > T[SA[i]]) {
      if(verbose) {
        fprintf(stderr, "Suffixes in wrong order.\n"
                        "  T[SA[%" PRIdSAIDX_T "]=%" PRIdSAIDX_T "]=%d"
                        " > T[SA[%" PRIdSAIDX_T "]=%" PRIdSAIDX_T "]=%d\n",
                        i - 1, SA[i - 1], T[SA[i - 1]], i, SA[i], T[SA[i]]);
      }
      return -3;
    }
  }

  /* check suffixes. */
  for(i = 0; i < ALPHABET_SIZE; ++i) { C[i] = 0; }
  for(i = 0; i < n; ++i) { ++C[T[i]]; }
  for(i = 0, p = 0; i < ALPHABET_SIZE; ++i) {
    t = C[i];
    C[i] = p;
    p += t;
  }

  q = C[T[n - 1]];
  C[T[n - 1]] += 1;
  for(i = 0; i < n; ++i) {
    p = SA[i];
    if(0 < p) {
      c = T[--p];
      t = C[c];
    } else {
      c = T[p = n - 1];
      t = q;
    }
    if((t < 0) || (p != SA[t])) {
      if(verbose) {
        fprintf(stderr, "Suffix in wrong position.\n"
                        "  SA[%" PRIdSAIDX_T "]=%" PRIdSAIDX_T " or\n"
                        "  SA[%" PRIdSAIDX_T "]=%" PRIdSAIDX_T "\n",
                        t, (0 <= t) ? SA[t] : -1, i, SA[i]);
      }
      return -4;
    }
    if(t != q) {
      ++C[c];
      if((n <= C[c]) || (T[SA[C[c]]] != c)) { C[c] = -1; }
    }
  }

  if(1 <= verbose) { fprintf(stderr, "Done.\n"); }
  return 0;
}